

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float32_to_floatx80_riscv64(float32 a,float_status *status)

{
  int iVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  floatx80 fVar9;
  floatx80 fVar10;
  floatx80 fVar11;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar2 = a & 0x7fffff;
  iVar1 = (int)a >> 0x1f;
  if ((char)(a >> 0x17) == '\0') {
    if (uVar2 != 0) {
      uVar5 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar2 = uVar2 << ((char)(uVar5 ^ 0x1f) - 8U & 0x1f);
      uVar5 = 9 - (uVar5 ^ 0x1f);
      goto LAB_00c412f7;
    }
    uVar2 = iVar1 * -0x8000;
    uVar4 = 0;
  }
  else {
    uVar5 = a >> 0x17 & 0xff;
    if (uVar5 != 0xff) {
LAB_00c412f7:
      fVar10.low = (ulong)(uVar2 | 0x800000) << 0x28;
      fVar10._8_4_ = uVar5 + iVar1 * -0x8000 + 0x3f80;
      fVar10._12_4_ = 0;
      return fVar10;
    }
    if (uVar2 != 0) {
      if ((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      bVar7 = status->default_nan_mode == '\0';
      bVar8 = (a & 0x7fffff) != 0;
      uVar3 = 0xc000000000000000;
      if (bVar8 && bVar7) {
        uVar3 = ((ulong)a | 0xffffffffff800000) << 0x28;
      }
      uVar6 = 0xffff;
      if (bVar8 && bVar7) {
        uVar6 = (ulong)(iVar1 * -0x8000 | 0x7fff);
      }
      fVar9._8_8_ = uVar6;
      fVar9.low = uVar3;
      return fVar9;
    }
    uVar2 = iVar1 * -0x8000 | 0x7fff;
    uVar4 = 0x8000000000000000;
  }
  fVar11._8_4_ = uVar2;
  fVar11.low = uVar4;
  fVar11._12_4_ = 0;
  return fVar11;
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}